

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<chatra::Node> *
chatra::
addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
          (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           *container,shared_ptr<chatra::Line> *line,NodeType type)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined7 in_register_00000011;
  shared_ptr<chatra::Node> local_48;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,type);
  local_48.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xd0);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00246ba8;
  memset((element_type *)(p_Var3 + 1),0,0xc0);
  *(undefined4 *)((long)&p_Var3[4]._vptr__Sp_counted_base + 4) = 0xffffffff;
  p_Var3[4]._M_use_count = 0;
  p_Var3[4]._M_weak_count = 0;
  *(undefined1 *)&p_Var3[5]._vptr__Sp_counted_base = 0xff;
  *(undefined8 *)((long)&p_Var3[5]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[5]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[6]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[6]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[7]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[7]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[8]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[8]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[9]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[9]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[10]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[10]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[0xb]._vptr__Sp_counted_base + 4) = 0;
  *(undefined8 *)&p_Var3[0xb]._M_weak_count = 0;
  p_Var3[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[0xc]._M_use_count = 0;
  p_Var3[0xc]._M_weak_count = 0;
  local_48.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  local_48.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
  emplace_back<std::shared_ptr<chatra::Node>>
            ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>> *)
             container,&local_48);
  if (local_48.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  psVar1 = (container->
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  peVar2 = psVar1[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->type = (NodeType)local_34;
  (peVar2->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (line->super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(line->super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return psVar1 + -1;
}

Assistant:

static std::shared_ptr<Node>& addNode(NodePtrContainer& container, const std::shared_ptr<Line>& line, NodeType type) {
	container.emplace_back(std::make_shared<Node>());
	auto& node = container.back();

	node->type = type;
	node->line = line;
	return node;
}